

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmAndiEa<(moira::Instr)57,(moira::Mode)6,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  int iVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  Ea<(moira::Mode)6,_1> dst;
  Ea<(moira::Mode)6,_1> local_3c;
  
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[6])();
  Op<(moira::Mode)6,1>(&local_3c,this,op & 7,addr);
  if (str->style->syntax == MUSASHI) {
    cVar3 = 'e';
    lVar6 = 0;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar3;
      cVar3 = "eori"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    pcVar5 = str->ptr;
    SVar1 = str->style->syntax;
    str->ptr = pcVar5 + 1;
    if (2 < SVar1 - MOIRA_MIT) {
      *pcVar5 = '.';
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
    }
    *pcVar5 = 'b';
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    }
    else {
      iVar2 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar2);
    }
    str->ptr = pcVar5 + 1;
    *pcVar5 = '#';
    StrWriter::operator<<(str,(UInt)(uVar4 & 0xff));
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ',';
    SVar1 = str->style->syntax;
    if ((MUSASHI < SVar1) || (cVar3 = ' ', (0x13U >> (SVar1 & 0x1f) & 1) == 0)) goto LAB_002105ba;
  }
  else {
    cVar3 = 'e';
    lVar6 = 0;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar3;
      cVar3 = "eori"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    pcVar5 = str->ptr;
    SVar1 = str->style->syntax;
    str->ptr = pcVar5 + 1;
    if (2 < SVar1 - MOIRA_MIT) {
      *pcVar5 = '.';
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
    }
    *pcVar5 = 'b';
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    }
    else {
      iVar2 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar2);
    }
    str->ptr = pcVar5 + 1;
    *pcVar5 = '#';
    StrWriter::operator<<(str,(Int)(int)(char)uVar4);
    cVar3 = ',';
  }
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = cVar3;
LAB_002105ba:
  StrWriter::operator<<(str,&local_3c);
  return;
}

Assistant:

void
Moira::dasmAndiEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    if (str.style.syntax == Syntax::MUSASHI) {
        str << Ins<I>{} << Sz<S>{} << str.tab << Imu<S>{src} << Sep{} << dst;
    } else {
        str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(src) << "," << dst;
    }
}